

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O3

void __thiscall
Messages::Person_PhoneNumber::Person_PhoneNumber(Person_PhoneNumber *this,Person_PhoneNumber *from)

{
  Arena *arena;
  
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined ***)this = &PTR__Person_PhoneNumber_0010eaf8;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  if ((*(ulong *)&from->field_0x8 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              ((InternalMetadata *)&this->field_0x8,
               (UnknownFieldSet *)((*(ulong *)&from->field_0x8 & 0xfffffffffffffffe) + 8));
  }
  (this->number_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 1) != 0) {
    arena = *(Arena **)&this->field_0x8;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    google::protobuf::internal::ArenaStringPtr::CreateInstance
              (&this->number_,arena,(from->number_).ptr_);
  }
  this->type_ = from->type_;
  return;
}

Assistant:

Person_PhoneNumber::Person_PhoneNumber(const Person_PhoneNumber& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _has_bits_(from._has_bits_) {
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  number_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_number()) {
    number_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_number(),
      GetArena());
  }
  type_ = from.type_;
  // @@protoc_insertion_point(copy_constructor:Messages.Person.PhoneNumber)
}